

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BroadcastToStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_broadcasttostatic
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  BroadcastToStaticLayerParams *pBVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_broadcasttostatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_broadcasttostatic(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pBVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::BroadcastToStaticLayerParams>(arena);
    (this->layer_).broadcasttostatic_ = pBVar2;
  }
  return (BroadcastToStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToStaticLayerParams* NeuralNetworkLayer::_internal_mutable_broadcasttostatic() {
  if (!_internal_has_broadcasttostatic()) {
    clear_layer();
    set_has_broadcasttostatic();
    layer_.broadcasttostatic_ = CreateMaybeMessage< ::CoreML::Specification::BroadcastToStaticLayerParams >(GetArenaForAllocation());
  }
  return layer_.broadcasttostatic_;
}